

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<unsigned_int>_>::
UpdateWindowState<duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>,_unsigned_int>
::Left(UpdateWindowState<duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>,_unsigned_int>
       *this,idx_t begin,idx_t end)

{
  unsigned_long *puVar1;
  ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *pMVar2;
  ColumnDataScanState *pCVar3;
  reference pvVar4;
  ulong uVar5;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pMVar2 = this->included->state;
        pCVar3 = pMVar2->scan;
        if (((ColumnDataScanState *)pCVar3->next_row_index <= begin) ||
           (begin < (ColumnDataScanState *)pCVar3->current_row_index)) {
          duckdb::ColumnDataCollection::Seek
                    ((ulong)pMVar2->inputs,(ColumnDataScanState *)begin,(DataChunk *)pCVar3);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pMVar2->page,0);
          pMVar2->data = *(uint **)(pvVar4 + 0x20);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pMVar2->page,0);
          FlatVector::VerifyFlatVector(pvVar4);
          pMVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
        }
        puVar1 = (pMVar2->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (uVar5 = begin - pMVar2->scan->current_row_index,
           (puVar1[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1) != 0)) {
          ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>::ModeRm(this->state,begin);
        }
      }
      begin = (long)&(((ColumnDataScanState *)begin)->current_chunk_state).handles._M_h._M_buckets +
              1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}